

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_fgets_malloc(FILE *f)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  int local_354;
  FILE *pFStack_350;
  int len;
  char *a;
  char *p;
  char local_338 [4];
  int n;
  char quick_buffer [800];
  FILE *f_local;
  
  quick_buffer[0x316] = '\0';
  quick_buffer._792_8_ = f;
  pcVar2 = fgets(local_338,800,(FILE *)f);
  if (pcVar2 == (char *)0x0) {
    f_local = (FILE *)0x0;
  }
  else if (quick_buffer[0x316] == '\0') {
    sVar3 = strlen(local_338);
    iVar1 = (int)sVar3;
    if ((0 < iVar1) && (local_338[iVar1 + -1] == '\n')) {
      local_338[iVar1 + -1] = '\0';
    }
    f_local = (FILE *)strdup(local_338);
  }
  else {
    pFStack_350 = (FILE *)strdup(local_338);
    local_354 = 799;
    while( true ) {
      iVar1 = feof((FILE *)quick_buffer._792_8_);
      if ((iVar1 != 0) || (*(char *)((long)&pFStack_350->_flags + (long)(local_354 + -1)) == '\n'))
      goto LAB_001c7d9b;
      pFStack_350 = (FILE *)realloc(pFStack_350,(long)(local_354 << 1));
      pcVar2 = (char *)((long)&pFStack_350->_flags + (long)local_354);
      pcVar2[local_354 + -2] = '\0';
      pcVar4 = fgets(pcVar2,local_354,(FILE *)quick_buffer._792_8_);
      if (pcVar4 == (char *)0x0) goto LAB_001c7d9b;
      if (pcVar2[local_354 + -2] == '\0') break;
      local_354 = local_354 * 2 + -1;
    }
    sVar3 = strlen(pcVar2);
    local_354 = local_354 + (int)sVar3;
LAB_001c7d9b:
    if (*(char *)((long)&pFStack_350->_flags + (long)(local_354 + -1)) == '\n') {
      *(char *)((long)&pFStack_350->_flags + (long)(local_354 + -1)) = '\0';
    }
    f_local = pFStack_350;
  }
  return (char *)f_local;
}

Assistant:

char * stb_fgets_malloc(FILE *f)
{
   // avoid reallocing for small strings
   char quick_buffer[800];
   quick_buffer[sizeof(quick_buffer)-2] = 0;
   if (!fgets(quick_buffer, sizeof(quick_buffer), f))
      return NULL;

   if (quick_buffer[sizeof(quick_buffer)-2] == 0) {
      int n = strlen(quick_buffer);
      if (n > 0 && quick_buffer[n-1] == '\n')
         quick_buffer[n-1] = 0;
      return strdup(quick_buffer);
   } else {
      char *p;
      char *a = strdup(quick_buffer);
      int len = sizeof(quick_buffer)-1;

      while (!feof(f)) {
         if (a[len-1] == '\n') break;
         a = (char *) realloc(a, len*2);
         p = &a[len];
         p[len-2] = 0;
         if (!fgets(p, len, f))
            break;
         if (p[len-2] == 0) {
            len += strlen(p);
            break;
         }
         len = len + (len-1);
      }
      if (a[len-1] == '\n')
         a[len-1] = 0;
      return a;
   }
}